

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageLevel.cpp
# Opt level: O0

FlatImageChannel * __thiscall Imf_3_2::FlatImageLevel::channel(FlatImageLevel *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
  *in_RDI;
  iterator i;
  string *in_stack_00000188;
  ImageLevel *in_stack_00000190;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
       ::find(in_RDI,(key_type *)0x12f445);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
       ::end(in_RDI);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    ImageLevel::throwBadChannelName(in_stack_00000190,in_stack_00000188);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>
                         *)0x12f489);
  return ppVar2->second;
}

Assistant:

FlatImageChannel&
FlatImageLevel::channel (const string& name)
{
    ChannelMap::iterator i = _channels.find (name);

    if (i == _channels.end ()) throwBadChannelName (name);

    return *i->second;
}